

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

u32 __thiscall irr::gui::CGUIListBox::addItem(CGUIListBox *this,wchar_t *text,s32 icon)

{
  u32 uVar1;
  array<irr::gui::CGUIListBox::ListItem> *in_RDI;
  ListItem i;
  ListItem *in_stack_ffffffffffffff88;
  s32 in_stack_ffffffffffffff9c;
  CGUIListBox *in_stack_ffffffffffffffa0;
  string<wchar_t> *in_stack_ffffffffffffffa8;
  CGUIListBox *in_stack_ffffffffffffffd0;
  
  ListItem::ListItem((ListItem *)in_stack_ffffffffffffffa0);
  core::string<wchar_t>::operator=(in_stack_ffffffffffffffa8,(wchar_t *)in_stack_ffffffffffffffa0);
  core::array<irr::gui::CGUIListBox::ListItem>::push_back(in_RDI,in_stack_ffffffffffffff88);
  recalculateItemHeight(in_stack_ffffffffffffffd0);
  recalculateItemWidth(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  uVar1 = core::array<irr::gui::CGUIListBox::ListItem>::size
                    ((array<irr::gui::CGUIListBox::ListItem> *)0x3c2c0c);
  uVar1 = uVar1 - 1;
  ListItem::~ListItem((ListItem *)0x3c2c1d);
  return uVar1;
}

Assistant:

u32 CGUIListBox::addItem(const wchar_t *text, s32 icon)
{
	ListItem i;
	i.Text = text;
	i.Icon = icon;

	Items.push_back(i);
	recalculateItemHeight();
	recalculateItemWidth(icon);

	return Items.size() - 1;
}